

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateHashCode
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  char *text;
  LogFinisher local_51;
  LogMessage local_50;
  
  io::Printer::Print(printer,&this->variables_,"hash = (37 * hash) + $constant_name$;\n");
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
    text = "hash = (53 * hash) + get$capitalized_name$();\n";
    break;
  case JAVATYPE_LONG:
    text = 
    "hash = (53 * hash) + com.google.protobuf.Internal.hashLong(\n    get$capitalized_name$());\n";
    break;
  case JAVATYPE_FLOAT:
    text = "hash = (53 * hash) + java.lang.Float.floatToIntBits(\n    get$capitalized_name$());\n";
    break;
  case JAVATYPE_DOUBLE:
    text = 
    "hash = (53 * hash) + com.google.protobuf.Internal.hashLong(\n    java.lang.Double.doubleToLongBits(get$capitalized_name$()));\n"
    ;
    break;
  case JAVATYPE_BOOLEAN:
    text = 
    "hash = (53 * hash) + com.google.protobuf.Internal.hashBoolean(\n    get$capitalized_name$());\n"
    ;
    break;
  case JAVATYPE_STRING:
  case JAVATYPE_BYTES:
    text = "hash = (53 * hash) + get$capitalized_name$().hashCode();\n";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_primitive_field_lite.cc"
               ,0x1c5);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    return;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::
GenerateHashCode(io::Printer* printer) const {
  printer->Print(variables_,
    "hash = (37 * hash) + $constant_name$;\n");
  switch (GetJavaType(descriptor_)) {
    case JAVATYPE_INT:
      printer->Print(variables_,
        "hash = (53 * hash) + get$capitalized_name$();\n");
      break;

    case JAVATYPE_LONG:
      printer->Print(variables_,
        "hash = (53 * hash) + com.google.protobuf.Internal.hashLong(\n"
        "    get$capitalized_name$());\n");
      break;

    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
        "hash = (53 * hash) + com.google.protobuf.Internal.hashBoolean(\n"
        "    get$capitalized_name$());\n");
      break;

    case JAVATYPE_FLOAT:
      printer->Print(variables_,
        "hash = (53 * hash) + java.lang.Float.floatToIntBits(\n"
        "    get$capitalized_name$());\n");
      break;

    case JAVATYPE_DOUBLE:
      printer->Print(variables_,
        "hash = (53 * hash) + com.google.protobuf.Internal.hashLong(\n"
        "    java.lang.Double.doubleToLongBits(get$capitalized_name$()));\n");
      break;

    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
      printer->Print(variables_,
        "hash = (53 * hash) + get$capitalized_name$().hashCode();\n");
      break;

    case JAVATYPE_ENUM:
    case JAVATYPE_MESSAGE:
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      break;
  }
}